

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_false,_true>::visitDrop
          (SimplifyLocals<true,_false,_true> *this,Drop *curr)

{
  LocalSet *this_00;
  bool bVar1;
  
  this_00 = (LocalSet *)curr->value;
  if ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
      LocalSetId) {
    return;
  }
  bVar1 = LocalSet::isTee(this_00);
  if (bVar1) {
    LocalSet::makeSet(this_00);
    Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
    ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                      *)&(this->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                     ,(Expression *)this_00);
    return;
  }
  __assert_fail("set->isTee()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                ,0x128,
                "void wasm::SimplifyLocals<true, false>::visitDrop(Drop *) [allowTee = true, allowStructure = false, allowNesting = true]"
               );
}

Assistant:

void visitDrop(Drop* curr) {
    // collapse drop-tee into set, which can occur if a get was sunk into a tee
    auto* set = curr->value->dynCast<LocalSet>();
    if (set) {
      assert(set->isTee());
      set->makeSet();
      this->replaceCurrent(set);
    }
  }